

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void map_spawn_chests(void *map_void)

{
  pointer plVar1;
  int iVar2;
  _List_const_iterator<Map_Chest_Spawn> _Var3;
  bool bVar4;
  list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *plVar5;
  pointer __x;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  __shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  shared_ptr<Map_Chest> chest;
  vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
  spawns;
  Map_Chest_Spawn spawn;
  __shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> local_a8;
  vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
  local_98;
  _List_const_iterator<Map_Chest_Spawn> local_78;
  _List_node_base *p_Stack_70;
  int local_68;
  short sStack_64;
  _List_node_base *p_Stack_60;
  Map *local_50;
  __shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> *local_40;
  double local_38;
  
  local_38 = Timer::GetTime();
  local_48 = *(__shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> **)((long)map_void + 0x58);
  local_50 = (Map *)map_void;
  for (p_Var8 = *(__shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> **)((long)map_void + 0x50);
      p_Var8 != local_48; p_Var8 = p_Var8 + 1) {
    std::__shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_a8,p_Var8);
    local_98.
    super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)0x0;
    local_98.
    super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)0x0;
    std::
    vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
    ::resize(&local_98,(long)(local_a8._M_ptr)->slots);
    plVar5 = &(local_a8._M_ptr)->spawns;
    p_Var7 = (_List_node_base *)plVar5;
    while (plVar1 = local_98.
                    super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          p_Var7 = (((_List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)
                    &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar5) {
      local_78._M_node = p_Var7[1]._M_next;
      p_Stack_70 = p_Var7[1]._M_prev;
      _local_68 = p_Var7[2]._M_next;
      p_Stack_60 = p_Var7[2]._M_prev;
      if ((double)(int)sStack_64 * 60.0 + (double)p_Stack_60 < local_38) {
        bVar4 = false;
        p_Var6 = (_List_node_base *)&(local_a8._M_ptr)->items;
        while( true ) {
          p_Var6 = (((_List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)&p_Var6->_M_next
                    )->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var6 == (_List_node_base *)&(local_a8._M_ptr)->items) break;
          bVar4 = (bool)(bVar4 | *(int *)&p_Var6[1]._M_prev == local_68);
        }
        if (!bVar4) {
          std::__cxx11::list<Map_Chest_Spawn,std::allocator<Map_Chest_Spawn>>::
          emplace_back<Map_Chest_Spawn_const&>
                    ((list<Map_Chest_Spawn,std::allocator<Map_Chest_Spawn>> *)
                     (local_98.
                      super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (local_68 + -1)),
                     (Map_Chest_Spawn *)&local_78);
        }
      }
    }
    bVar4 = false;
    local_40 = p_Var8;
    for (__x = local_98.
               super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; p_Var8 = local_40, __x != plVar1;
        __x = __x + 1) {
      std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::list
                ((list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)&local_78,__x);
      _Var3._M_node = local_78._M_node;
      if ((Map_Chest_Spawn *)local_78._M_node != (Map_Chest_Spawn *)&local_78) {
        iVar2 = util::rand();
        _Var3 = std::next<std::_List_const_iterator<Map_Chest_Spawn>>(_Var3,(long)iVar2);
        bVar4 = true;
        Map_Chest::AddItem(local_a8._M_ptr,*(short *)((long)&_Var3._M_node[1]._M_next + 4),
                           *(int *)&_Var3._M_node[1]._M_prev,*(int *)&_Var3._M_node[2]._M_next);
      }
      std::__cxx11::_List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::_M_clear
                ((_List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)&local_78);
    }
    if (bVar4) {
      Map_Chest::Update(local_a8._M_ptr,local_50,(Character *)0x0);
    }
    std::
    vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
    ::~vector(&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  }
  return;
}

Assistant:

void map_spawn_chests(void *map_void)
{
	Map *map(static_cast<Map *>(map_void));

	double current_time = Timer::GetTime();
	UTIL_FOREACH(map->chests, chest)
	{
		bool needs_update = false;

		std::vector<std::list<Map_Chest_Spawn>> spawns;
		spawns.resize(chest->slots);

		UTIL_FOREACH(chest->spawns, spawn)
		{
			if (spawn.last_taken + spawn.time*60.0 < current_time)
			{
				bool slot_used = false;

				UTIL_FOREACH(chest->items, item)
				{
					if (item.slot == spawn.slot)
					{
						slot_used = true;
					}
				}

				if (!slot_used)
				{
					spawns[spawn.slot - 1].emplace_back(spawn);
				}
			}
		}

		UTIL_FOREACH(spawns, slot_spawns)
		{
			if (!slot_spawns.empty())
			{
				const Map_Chest_Spawn& spawn = *std::next(slot_spawns.cbegin(), util::rand(0, slot_spawns.size() - 1));

				chest->AddItem(spawn.item.id, spawn.item.amount, spawn.slot);
				needs_update = true;

#ifdef DEBUG
				Console::Dbg("Spawning chest item %i (x%i) on map %i", spawn.item.id, spawn.item.amount, map->id);
#endif // DEBUG
			}
		}

		if (needs_update)
		{
			chest->Update(map, 0);
		}
	}
}